

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::DoMaxima(Clipper *this,TEdge *e,long64 topY)

{
  long64 lVar1;
  TEdge *pTVar2;
  TEdge **ppTVar3;
  clipperException *this_00;
  TEdge **ppTVar4;
  TEdge *pTVar5;
  TEdge *e2;
  IntPoint local_40;
  
  e2 = e->next;
  if ((((e2 == (TEdge *)0x0) || (e2->ytop != e->ytop)) || (e2->nextInLML != (TEdge *)0x0)) ||
     (e2->xtop != e->xtop)) {
    e2 = e->prev;
  }
  lVar1 = e->xtop;
  pTVar5 = e->nextInAEL;
  if (pTVar5 != e2) {
    do {
      if (pTVar5 == (TEdge *)0x0) {
        this_00 = (clipperException *)__cxa_allocate_exception(0x28);
        clipperException::clipperException(this_00,"DoMaxima error");
        goto LAB_0070398b;
      }
      local_40.X = lVar1;
      local_40.Y = topY;
      IntersectEdges(this,e,pTVar5,&local_40,ipBoth);
      pTVar5 = pTVar5->nextInAEL;
    } while (pTVar5 != e2);
  }
  if ((e->outIdx < 0) && (e2->outIdx < 0)) {
    pTVar5 = e->nextInAEL;
    pTVar2 = e->prevInAEL;
    ppTVar3 = &this->m_ActiveEdges;
    if ((pTVar2 != (TEdge *)0x0) || ((pTVar5 != (TEdge *)0x0 || (this->m_ActiveEdges == e)))) {
      ppTVar4 = &pTVar2->nextInAEL;
      if (pTVar2 == (TEdge *)0x0) {
        ppTVar4 = ppTVar3;
      }
      *ppTVar4 = pTVar5;
      if (pTVar5 != (TEdge *)0x0) {
        pTVar5->prevInAEL = pTVar2;
      }
      e->nextInAEL = (TEdge *)0x0;
      e->prevInAEL = (TEdge *)0x0;
    }
    pTVar5 = e2->nextInAEL;
    pTVar2 = e2->prevInAEL;
    if (((pTVar2 != (TEdge *)0x0) || (pTVar5 != (TEdge *)0x0)) || (*ppTVar3 == e2)) {
      if (pTVar2 != (TEdge *)0x0) {
        ppTVar3 = &pTVar2->nextInAEL;
      }
      *ppTVar3 = pTVar5;
      if (pTVar5 != (TEdge *)0x0) {
        pTVar5->prevInAEL = pTVar2;
      }
      e2->nextInAEL = (TEdge *)0x0;
      e2->prevInAEL = (TEdge *)0x0;
    }
  }
  else {
    if ((e->outIdx < 0) || (e2->outIdx < 0)) {
      this_00 = (clipperException *)__cxa_allocate_exception(0x28);
      clipperException::clipperException(this_00,"DoMaxima error");
LAB_0070398b:
      __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
    }
    local_40.X = lVar1;
    local_40.Y = topY;
    IntersectEdges(this,e,e2,&local_40,ipNone);
  }
  return;
}

Assistant:

void Clipper::DoMaxima(TEdge *e, long64 topY)
{
  TEdge* eMaxPair = GetMaximaPair(e);
  long64 X = e->xtop;
  TEdge* eNext = e->nextInAEL;
  while( eNext != eMaxPair )
  {
    if (!eNext) throw clipperException("DoMaxima error");
    IntersectEdges( e, eNext, IntPoint(X, topY), ipBoth );
    eNext = eNext->nextInAEL;
  }
  if( e->outIdx < 0 && eMaxPair->outIdx < 0 )
  {
    DeleteFromAEL( e );
    DeleteFromAEL( eMaxPair );
  }
  else if( e->outIdx >= 0 && eMaxPair->outIdx >= 0 )
  {
    IntersectEdges( e, eMaxPair, IntPoint(X, topY), ipNone );
  }
  else throw clipperException("DoMaxima error");
}